

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec3.cpp
# Opt level: O0

Vec3 random_in_unit_disk_2(void)

{
  Vec3 *in_RDI;
  float e0;
  double dVar1;
  undefined4 extraout_XMM0_Db;
  Vec3 VVar2;
  Vec3 *_point;
  undefined4 in_stack_ffffffffffffffa0;
  Vec3 local_48 [2];
  Vec3 local_30;
  Vec3 local_24;
  Vec3 local_18;
  undefined1 local_9;
  
  local_9 = 0;
  Vec3::Vec3(in_RDI);
  do {
    dVar1 = drand48();
    e0 = (float)dVar1;
    dVar1 = drand48();
    Vec3::Vec3(&local_30,e0,(float)dVar1,0.0);
    operator*((float)((ulong)in_RDI >> 0x20),(Vec3 *)CONCAT44(e0,in_stack_ffffffffffffffa0));
    Vec3::Vec3(local_48,1.0,1.0,0.0);
    operator-(in_RDI,(Vec3 *)CONCAT44(e0,in_stack_ffffffffffffffa0));
    *(undefined8 *)in_RDI->e = local_18.e._0_8_;
    in_RDI->e[2] = local_18.e[2];
    Vec3::~Vec3(&local_18);
    Vec3::~Vec3(local_48);
    Vec3::~Vec3(&local_24);
    Vec3::~Vec3(&local_30);
    VVar2.e[0] = dot(in_RDI,in_RDI);
    VVar2.e[1] = (float)extraout_XMM0_Db;
  } while (1.0 <= VVar2.e[0]);
  VVar2.e[2] = 1.0;
  return (Vec3)VVar2.e;
}

Assistant:

Vec3
random_in_unit_disk_2(void)
{
    Vec3 _point;
    do {
        _point = 2.0f * Vec3(RANDOM_GEN(), RANDOM_GEN(), 0.0f) - Vec3(1.0f, 1.0f, 0.0f);

    } while (dot(_point,_point) >= 1.0f);

    return _point;
}